

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

Oop __thiscall Lodtalk::MethodCompiler::visitMethodAST(MethodCompiler *this,MethodAST *node)

{
  Assembler *pAVar1;
  VMContext *pVVar2;
  PragmaDefinition *this_00;
  pointer ppNVar3;
  LiteralNode *this_01;
  element_type *peVar4;
  Oop OVar5;
  bool bVar6;
  int iVar7;
  MethodHeader *this_02;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar8;
  ArgumentList *this_03;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *pvVar9;
  PragmaList *this_04;
  Pragmas *pPVar10;
  ObjectHeader *pOVar11;
  AdditionalMethodState *pAVar12;
  string *psVar13;
  Parameters *pPVar14;
  SmallIntegerValue SVar15;
  Pragma *pPVar16;
  LocalVariables *pLVar17;
  LocalVariables *pLVar18;
  SequenceNode *pSVar19;
  size_t i_2;
  pointer psVar20;
  long lVar21;
  LiteralNode *this_05;
  size_t i_1;
  long lVar22;
  size_t sVar23;
  ulong uVar24;
  ulong local_90;
  bool local_88;
  size_t local_80;
  Ref<Lodtalk::Pragma> pragmaObject;
  Oop number;
  
  this->localContext = &node->super_FunctionalNode;
  this->temporalVectorCount = 0;
  this_02 = AST::MethodAST::getHeader(node);
  pVVar2 = this->context;
  AST::MethodHeader::getSelector_abi_cxx11_((string *)&pragmaObject,this_02);
  aVar8 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeSelector(pVVar2,(string *)&pragmaObject)
  ;
  (this->selector).oop.field_0 = aVar8;
  std::__cxx11::string::~string((string *)&pragmaObject);
  this_03 = AST::MethodHeader::getArgumentList(this_02);
  if (this_03 == (ArgumentList *)0x0) {
    local_90 = 0;
  }
  else {
    pvVar9 = AST::ArgumentList::getArguments(this_03);
    local_90 = (long)(pvVar9->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar9->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  this_04 = AST::MethodAST::getPragmaList(node);
  if ((this_04 == (PragmaList *)0x0) ||
     (pPVar10 = AST::PragmaList::getPragmas(this_04),
     (pPVar10->
     super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
     )._M_impl.super__Vector_impl_data._M_start ==
     (pPVar10->
     super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
     )._M_impl.super__Vector_impl_data._M_finish)) {
    local_80 = 0;
    local_88 = false;
  }
  else {
    pPVar10 = AST::PragmaList::getPragmas(this_04);
    local_80 = (long)(pPVar10->
                     super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pPVar10->
                     super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
    OopRef::OopRef(&pragmaObject.reference,this->context);
    pOVar11 = (ObjectHeader *)AdditionalMethodState::basicNew(this->context,local_80);
    (this->additionalMethodState).reference.oop.field_0.header = pOVar11;
    pAVar12 = Ref<Lodtalk::AdditionalMethodState>::operator->(&this->additionalMethodState);
    pAVar12[2].super_Object.super_ProtoObject.object_header_ =
         (ObjectHeader)(this->selector).oop.field_0;
    local_88 = false;
    for (sVar23 = 0; sVar23 != local_80; sVar23 = sVar23 + 1) {
      this_00 = (pPVar10->
                super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
                )._M_impl.super__Vector_impl_data._M_start[sVar23];
      psVar13 = AST::PragmaDefinition::getSelectorString_abi_cxx11_(this_00);
      pPVar14 = AST::PragmaDefinition::getParameters(this_00);
      bVar6 = std::operator==(psVar13,"primitive:");
      if ((bVar6) || (bVar6 = std::operator==(psVar13,"primitive:error:"), bVar6)) {
        iVar7 = (*(*(pPVar14->
                    super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start)->_vptr_Node[3])();
        local_88 = true;
        if (((char)iVar7 != '\0') &&
           (number = AST::LiteralNode::getValue
                               ((LiteralNode *)
                                *(pPVar14->
                                 super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start),
           ((ulong)number.field_0 & 1) != 0)) {
          SVar15 = Oop::decodeSmallInteger(&number);
          MethodAssembler::Assembler::callPrimitive(&this->gen,(int)SVar15);
          local_88 = true;
          goto LAB_00145580;
        }
      }
      else {
        bVar6 = std::operator==(psVar13,"primitive:module:");
        if ((bVar6) || (bVar6 = std::operator==(psVar13,"primitive:module:error:"), bVar6)) {
          local_88 = true;
          MethodAssembler::Assembler::callPrimitive(&this->gen,0x100);
        }
LAB_00145580:
        pragmaObject.reference.oop.field_0 =
             (anon_union_8_4_0eb573b0_for_Oop_0)Pragma::create(this->context);
        pOVar11 = (ObjectHeader *)
                  Array::basicNativeNew
                            (this->context,
                             (long)(pPVar14->
                                   super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pPVar14->
                                   super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3);
        pPVar16 = Ref<Lodtalk::Pragma>::operator->(&pragmaObject);
        (pPVar16->arguments).field_0.header = pOVar11;
        pVVar2 = this->context;
        psVar13 = AST::PragmaDefinition::getSelectorString_abi_cxx11_(this_00);
        aVar8 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeByteSymbol(pVVar2,psVar13);
        pPVar16 = Ref<Lodtalk::Pragma>::operator->(&pragmaObject);
        OVar5 = pragmaObject.reference.oop;
        (pPVar16->keyword).field_0 = aVar8;
        pAVar12 = Ref<Lodtalk::AdditionalMethodState>::operator->(&this->additionalMethodState);
        *(anon_union_8_4_0eb573b0_for_Oop_0 *)(pAVar12 + sVar23 + 3) = OVar5.field_0;
        pPVar16 = Ref<Lodtalk::Pragma>::operator->(&pragmaObject);
        uVar24 = (pPVar16->arguments).field_0.uintValue;
        lVar21 = uVar24 + 8;
        if ((uVar24 & 7) != 0) {
          lVar21 = 0;
        }
        for (uVar24 = 0;
            ppNVar3 = (pPVar14->
                      super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                      )._M_impl.super__Vector_impl_data._M_start,
            uVar24 < (ulong)((long)(pPVar14->
                                   super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3)
            ; uVar24 = uVar24 + 1) {
          this_01 = (LiteralNode *)ppNVar3[uVar24];
          this_05 = this_01;
          iVar7 = (*(this_01->super_Node)._vptr_Node[3])();
          if ((char)iVar7 == '\0') {
            AbstractASTVisitor::error
                      ((AbstractASTVisitor *)this_05,(Node *)psVar13,
                       "Expected a literal for the pragma parameters.");
          }
          aVar8 = (anon_union_8_4_0eb573b0_for_Oop_0)AST::LiteralNode::getValue(this_01);
          *(anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar21 + uVar24 * 8) = aVar8;
        }
      }
    }
    OopRef::~OopRef(&pragmaObject.reference);
  }
  pLVar17 = AST::FunctionalNode::getLocalVariables(&node->super_FunctionalNode);
  psVar20 = (pLVar17->
            super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar21 = (long)(pLVar17->
                 super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar20 >> 4;
  iVar7 = this->temporalVectorCount;
  lVar22 = 0;
  while( true ) {
    bVar6 = lVar21 == 0;
    lVar21 = lVar21 + -1;
    if (bVar6) break;
    peVar4 = (psVar20->
             super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (peVar4->isCapturedInClosure_ == true) {
      peVar4->temporalVectorIndex = iVar7;
      peVar4->temporalIndex = (int)lVar22;
      lVar22 = lVar22 + 1;
    }
    psVar20 = psVar20 + 1;
  }
  if (lVar22 != 0) {
    this->temporalVectorCount = iVar7 + 1;
  }
  sVar23 = (size_t)(lVar22 != 0);
  pLVar18 = AST::FunctionalNode::getLocalVariables(&node->super_FunctionalNode);
  psVar20 = (pLVar18->
            super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar21 = (long)(pLVar18->
                 super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar20;
  iVar7 = this->temporalVectorCount;
  for (uVar24 = 0; lVar21 >> 4 != uVar24; uVar24 = uVar24 + 1) {
    peVar4 = (psVar20->
             super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (peVar4->isCapturedInClosure_ == false) {
      if (uVar24 < local_90) {
        peVar4->temporalIndex = (int)uVar24;
      }
      else {
        peVar4->temporalIndex = iVar7 + (int)uVar24;
        sVar23 = sVar23 + 1;
      }
    }
    psVar20 = psVar20 + 1;
  }
  if (lVar22 != 0) {
    pAVar1 = &this->gen;
    MethodAssembler::Assembler::pushNewArray(pAVar1,(int)lVar22);
    MethodAssembler::Assembler::popStoreTemporal(pAVar1,(int)local_90);
    lVar21 = 0;
    for (uVar24 = 0; local_90 != uVar24; uVar24 = uVar24 + 1) {
      psVar20 = (pLVar17->
                super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (*(char *)(*(long *)((long)&(psVar20->
                                     super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar21) + 0x19) == '\x01') {
        MethodAssembler::Assembler::pushTemporal(pAVar1,(int)uVar24);
        lVar22 = *(long *)((long)&(psVar20->
                                  super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + lVar21);
        MethodAssembler::Assembler::popStoreTemporalInVector
                  (pAVar1,*(int *)(lVar22 + 8),*(int *)(lVar22 + 0xc) + (int)local_90);
      }
      lVar21 = lVar21 + 0x10;
    }
  }
  pSVar19 = AST::MethodAST::getBody(node);
  (*(pSVar19->super_Node)._vptr_Node[2])(pSVar19,this);
  pAVar1 = &this->gen;
  bVar6 = MethodAssembler::Assembler::isLastReturn(pAVar1);
  if (!bVar6) {
    MethodAssembler::Assembler::returnReceiver(pAVar1);
  }
  OVar5.field_0 =
       (anon_union_8_4_0eb573b0_for_Oop_0)
       (this->additionalMethodState).reference.oop.field_0.pointer;
  if (OVar5.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
    MethodAssembler::Assembler::addLiteralAlways(pAVar1,&this->selector);
  }
  else {
    MethodAssembler::Assembler::addLiteralAlways(pAVar1,OVar5);
  }
  MethodAssembler::Assembler::addLiteralAlways(pAVar1,&this->classBinding);
  aVar8.header = (ObjectHeader *)
                 MethodAssembler::Assembler::generate(pAVar1,sVar23,local_90,local_88,0);
  if ((this->additionalMethodState).reference.oop.field_0.pointer != (uint8_t *)&NilObject) {
    pAVar12 = Ref<Lodtalk::AdditionalMethodState>::operator->(&this->additionalMethodState);
    ((anon_union_8_4_0eb573b0_for_Oop_0 *)(pAVar12 + 1))->header = (ObjectHeader *)aVar8;
    pAVar12 = Ref<Lodtalk::AdditionalMethodState>::operator->(&this->additionalMethodState);
    for (sVar23 = 0; local_80 != sVar23; sVar23 = sVar23 + 1) {
      ((anon_union_8_4_0eb573b0_for_Oop_0 *)
      ((long)pAVar12[sVar23 + 3].super_Object.super_ProtoObject.object_header_ + 8))->header =
           (ObjectHeader *)aVar8;
    }
  }
  return (Oop)aVar8;
}

Assistant:

Oop MethodCompiler::visitMethodAST(MethodAST *node)
{
    size_t temporalCount = 0;
    size_t argumentCount = 0;

    // Set the local context
    localContext = node;
    temporalVectorCount = 0;

	// Get the method selector.
	auto header = node->getHeader();
	selector = context->makeSelector(header->getSelector());

	// Process the arguments
	auto argumentList = header->getArgumentList();
	if(argumentList)
        argumentCount = argumentList->getArguments().size();

    // Process the pragmas.
    // Vist the pragmas
    auto pragmaList = node->getPragmaList();
    bool hasPrimitive = false;
    size_t pragmaCount = 0;
    if(pragmaList && !pragmaList->getPragmas().empty())
    {
        auto &pragmas = pragmaList->getPragmas();
        pragmaCount = pragmas.size();

        Ref<Pragma> pragmaObject(context);

        additionalMethodState = AdditionalMethodState::basicNew(context, pragmaCount);
        additionalMethodState->setSelector(selector.oop);

        for(size_t i = 0; i < pragmaCount; ++i)
        {
            auto pragma = pragmas[i];
            auto &selector = pragma->getSelectorString();
            auto &params = pragma->getParameters();
            if(selector == "primitive:" || selector == "primitive:error:")
            {
                // Numbered primitive.
                hasPrimitive = true;

                // Ensure the number parameter is a literal
                auto numberParam = params[0];
                if(!numberParam->isLiteral())
                    continue;

                // Read the number parameter.
                auto numberParamLiteral = static_cast<LiteralNode*> (params[0]);
                auto number = numberParamLiteral->getValue();
                if(!number.isSmallInteger())
                    continue;

                // Call the primitive.
                hasPrimitive = true;
                gen.callPrimitive((int)number.decodeSmallInteger());
            }
            else if(selector == "primitive:module:" || selector == "primitive:module:error:")
            {
                // Named primitive.
                hasPrimitive = true;
                gen.callPrimitive(256);
            }

            // Create the pragma.
            pragmaObject = Pragma::create(context);
            pragmaObject->arguments = Oop::fromPointer(Array::basicNativeNew(context, params.size()));
            pragmaObject->keyword = context->makeByteSymbol(pragma->getSelectorString());
            additionalMethodState->getIndexableElements()[i] = pragmaObject.getOop();

            // Set the arguments.
            auto argumentsData = reinterpret_cast<Oop*> (pragmaObject->arguments.getFirstFieldPointer());
            for(size_t j = 0; j < params.size(); ++j)
            {
                auto paramNode = params[j];
                if(!paramNode->isLiteral())
                    error(paramNode, "Expected a literal for the pragma parameters.");

                auto paramLiteralNode = static_cast<LiteralNode*> (paramNode);
                argumentsData[j] = paramLiteralNode->getValue();
            }
        }
    }

    // Count the captured variables.
    auto &blockLocals = node->getLocalVariables();
    size_t capturedCount = 0;
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
        {
            localVar->setTemporalVectorIndex(temporalVectorCount);
            localVar->setTemporalIndex(int(capturedCount++));
        }
    }

    if(capturedCount)
    {
        ++temporalVectorCount;
        ++temporalCount;
    }

    // Compute the local variables indices.
    auto &localVars = node->getLocalVariables();
    for(size_t i = 0; i < localVars.size(); ++i)
    {
        auto &localVar = localVars[i];
        if(!localVar->isCapturedInClosure())
        {
            if(i < argumentCount)
                localVar->setTemporalIndex((int)i);
            else
            {
                localVar->setTemporalIndex(int(i + temporalVectorCount));
                ++temporalCount;
            }
        }
    }

    // Create the temporal vector
    if(capturedCount)
    {
        gen.pushNewArray((int)capturedCount);
        gen.popStoreTemporal((int)argumentCount);

        // Copy the captured arguments into the temp vector
        for(size_t i = 0; i < argumentCount; ++i)
        {
            auto &localVar = blockLocals[i];
            if(localVar->isCapturedInClosure())
            {
                gen.pushTemporal((int)i);
                gen.popStoreTemporalInVector(localVar->getTemporalIndex(), int(argumentCount + localVar->getTemporalVectorIndex()));
            }
        }
    }

	// Visit the method body
	node->getBody()->acceptVisitor(this);

	// Always return
	if(!gen.isLastReturn())
		gen.returnReceiver();

	// Set the method selector/additonal method state.
    if(!additionalMethodState.isNil())
        gen.addLiteralAlways(additionalMethodState.getOop());
    else
        gen.addLiteralAlways(selector);

	// Set the class binding.
	gen.addLiteralAlways(classBinding);
	Oop result = Oop::fromPointer(gen.generate(temporalCount, argumentCount, hasPrimitive));

    // Set some back pointers.
    if(!additionalMethodState.isNil())
    {
        additionalMethodState->setMethod(result);
        auto pragmas = additionalMethodState->getIndexableElements();
        for(size_t i = 0; i < pragmaCount; ++i)
        {
            auto pragma = reinterpret_cast<Pragma*> (pragmas[i].pointer);
            pragma->method = result;
        }
    }

    return result;
}